

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O1

type_conflict2
jsoncons::encode_base16<unsigned_char_const*,std::__cxx11::string>
          (uchar *first,uchar *last,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  uchar *puVar1;
  
  puVar1 = first;
  if (first != last) {
    do {
      std::__cxx11::string::push_back((char)result);
      std::__cxx11::string::push_back((char)result);
      puVar1 = puVar1 + 1;
    } while (puVar1 != last);
  }
  return ((long)last - (long)first) * 2;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base16(InputIt first, InputIt last, Container& result)
    {
        static constexpr char characters[] = "0123456789ABCDEF";

        for (auto it = first; it != last; ++it)
        {
            uint8_t c = *it;
            result.push_back(characters[c >> 4]);
            result.push_back(characters[c & 0xf]);
        }
        return (last-first)*2;
    }